

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::SimplifyRecurrentAddExpression
          (SENodeSimplifyImpl *this,SERecurrentNode *recurrent_expr)

{
  bool bVar1;
  int iVar2;
  ChildContainerType *this_00;
  SERecurrentNode *this_01;
  ScalarEvolutionAnalysis *pSVar3;
  Loop *loop;
  pointer pSVar4;
  SENode *pSVar5;
  reference ppSVar6;
  pointer pSVar7;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_68;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> local_60;
  SENode *local_58;
  SENode *simplified_child;
  SENode *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *__range2;
  unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> new_offset;
  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
  recurrent_node;
  vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_> *children;
  SERecurrentNode *recurrent_expr_local;
  SENodeSimplifyImpl *this_local;
  
  this_00 = SENode::GetChildren(this->node_);
  this_01 = (SERecurrentNode *)::operator_new(0x48);
  pSVar3 = SENode::GetParentAnalysis(&recurrent_expr->super_SENode);
  loop = SERecurrentNode::GetLoop(recurrent_expr);
  SERecurrentNode::SERecurrentNode(this_01,pSVar3,loop);
  std::
  unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>::
  unique_ptr<std::default_delete<spvtools::opt::SERecurrentNode>,void>
            ((unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>>
              *)&new_offset,this_01);
  pSVar4 = (pointer)::operator_new(0x30);
  pSVar3 = SENode::GetParentAnalysis(&recurrent_expr->super_SENode);
  SEAddNode::SEAddNode((SEAddNode *)pSVar4,pSVar3);
  std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
  unique_ptr<std::default_delete<spvtools::opt::SENode>,void>
            ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
             &__range2,pSVar4);
  pSVar4 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
           operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                       *)&__range2);
  pSVar5 = SERecurrentNode::GetOffset(recurrent_expr);
  (*pSVar4->_vptr_SENode[3])(pSVar4,pSVar5);
  __end2 = std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::begin
                     (this_00);
  child = (SENode *)
          std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>::end
                    (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
                                *)&child);
    if (!bVar1) break;
    ppSVar6 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
              ::operator*(&__end2);
    simplified_child = *ppSVar6;
    iVar2 = (**simplified_child->_vptr_SENode)();
    if (iVar2 != 1) {
      pSVar4 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::
               operator->((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                           *)&__range2);
      (*pSVar4->_vptr_SENode[3])(pSVar4,simplified_child);
    }
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
    ::operator++(&__end2);
  }
  pSVar3 = this->analysis_;
  pSVar4 = std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::get
                     ((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                       *)&__range2);
  local_58 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar3,pSVar4);
  iVar2 = (**local_58->_vptr_SENode)();
  if (iVar2 == 6) {
    pSVar3 = this->analysis_;
    std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::unique_ptr
              (&local_60,
               (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
               &__range2);
    pSVar5 = ScalarEvolutionAnalysis::GetCachedOrAdd(pSVar3,&local_60);
    SERecurrentNode::AddOffset(recurrent_expr,pSVar5);
    std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
              (&local_60);
  }
  else {
    pSVar7 = std::
             unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
             ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                           *)&new_offset);
    SERecurrentNode::AddOffset(pSVar7,local_58);
  }
  pSVar7 = std::
           unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
           ::operator->((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
                         *)&new_offset);
  pSVar5 = SERecurrentNode::GetCoefficient(recurrent_expr);
  SERecurrentNode::AddCoefficient(pSVar7,pSVar5);
  pSVar3 = this->analysis_;
  std::unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>>::
  unique_ptr<spvtools::opt::SERecurrentNode,std::default_delete<spvtools::opt::SERecurrentNode>,void>
            ((unique_ptr<spvtools::opt::SENode,std::default_delete<spvtools::opt::SENode>> *)
             &local_68,
             (unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
              *)&new_offset);
  pSVar5 = ScalarEvolutionAnalysis::GetCachedOrAdd(pSVar3,&local_68);
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
            (&local_68);
  std::unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>::~unique_ptr
            ((unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_> *)
             &__range2);
  std::
  unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::SERecurrentNode,_std::default_delete<spvtools::opt::SERecurrentNode>_>
               *)&new_offset);
  return pSVar5;
}

Assistant:

SENode* SENodeSimplifyImpl::SimplifyRecurrentAddExpression(
    SERecurrentNode* recurrent_expr) {
  const std::vector<SENode*>& children = node_->GetChildren();

  std::unique_ptr<SERecurrentNode> recurrent_node{new SERecurrentNode(
      recurrent_expr->GetParentAnalysis(), recurrent_expr->GetLoop())};

  // Create and simplify the new offset node.
  std::unique_ptr<SENode> new_offset{
      new SEAddNode(recurrent_expr->GetParentAnalysis())};
  new_offset->AddChild(recurrent_expr->GetOffset());

  for (SENode* child : children) {
    if (child->GetType() != SENode::RecurrentAddExpr) {
      new_offset->AddChild(child);
    }
  }

  // Simplify the new offset.
  SENode* simplified_child = analysis_.SimplifyExpression(new_offset.get());

  // If the child can be simplified, add the simplified form otherwise, add it
  // via the usual caching mechanism.
  if (simplified_child->GetType() != SENode::CanNotCompute) {
    recurrent_node->AddOffset(simplified_child);
  } else {
    recurrent_expr->AddOffset(analysis_.GetCachedOrAdd(std::move(new_offset)));
  }

  recurrent_node->AddCoefficient(recurrent_expr->GetCoefficient());

  return analysis_.GetCachedOrAdd(std::move(recurrent_node));
}